

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  cmOutputConverter *this_00;
  cmMakefile *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  size_t sVar6;
  char *__s;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar7;
  pointer ppcVar8;
  cmStateSnapshot *pcVar9;
  string outP;
  string parentBinDir;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  cmGeneratedFileStream fout;
  undefined1 local_370 [16];
  undefined1 local_360 [40];
  string local_338;
  undefined1 local_318 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_308;
  long *local_2d8 [2];
  long local_2c8 [2];
  string local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  undefined1 local_278 [584];
  
  pcVar1 = this->Makefile;
  local_360._24_8_ = this;
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CMAKE_TESTING_ENABLED","");
  bVar3 = cmMakefile::IsOn(pcVar1,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  uVar2 = local_360._24_8_;
  if (bVar3) {
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetConfigurations
              (&local_2b8,*(cmMakefile **)(local_360._24_8_ + 0x28),&local_298,false);
    pcVar9 = (cmStateSnapshot *)(uVar2 + 0x30);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_278,pcVar9);
    pcVar4 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)local_278);
    std::__cxx11::string::string((string *)local_2d8,pcVar4,(allocator *)local_370);
    std::__cxx11::string::append((char *)local_2d8);
    std::__cxx11::string::append((char *)local_2d8);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,(char *)local_2d8[0],false,None);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_278,true);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"# CMake generated Testfile for ",0x1f);
    std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
    std::ostream::put((char)local_278);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"# Source directory: ",0x14);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_370,pcVar9);
    pcVar4 = cmStateDirectory::GetCurrentSource((cmStateDirectory *)local_370);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,sVar6);
    }
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"# Build directory: ",0x13);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_318,pcVar9);
    pcVar4 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)local_318);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,sVar6);
    }
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"# ",2);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"# This file includes the relevant testing commands ",0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"required for ",0xd);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"# testing this directory and lists subdirectories to ",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"be tested as well.",0x12);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar1 = *(cmMakefile **)(local_360._24_8_ + 0x28);
    local_370._0_8_ = local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"TEST_INCLUDE_FILE","");
    pcVar4 = cmMakefile::GetProperty(pcVar1,(string *)local_370);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_360) {
      operator_delete((void *)local_370._0_8_,(ulong)(local_360._0_8_ + 1));
    }
    if (pcVar4 != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"include(\"",9);
      sVar6 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar4,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\")",2);
      std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
      std::ostream::put((char)local_278);
      std::ostream::flush();
    }
    pcVar1 = *(cmMakefile **)(local_360._24_8_ + 0x28);
    local_370._0_8_ = local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"TEST_INCLUDE_FILES","");
    pcVar4 = cmMakefile::GetProperty(pcVar1,(string *)local_370);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_360) {
      operator_delete((void *)local_370._0_8_,(ulong)(local_360._0_8_ + 1));
    }
    if (pcVar4 != (char *)0x0) {
      local_318._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
      local_318._8_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
      local_308.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_370._0_8_ = local_360;
      sVar6 = strlen(pcVar4);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_370,pcVar4,pcVar4 + sVar6);
      cmSystemTools::ExpandListArgument
                ((string *)local_370,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_318,false);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_360) {
        operator_delete((void *)local_370._0_8_,(ulong)(local_360._0_8_ + 1));
      }
      if (local_318._0_8_ != local_318._8_8_) {
        pcVar7 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_318._0_8_;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"include(\"",9);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_278,
                              (char *)(pcVar7->Data).
                                      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                              (long)(pcVar7->Data).
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")",2);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          pcVar7 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                   &(pcVar7->UpPositions).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        } while (pcVar7 != (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                           local_318._8_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_318);
    }
    pcVar1 = *(cmMakefile **)(local_360._24_8_ + 0x28);
    ppcVar8 = (pcVar1->TestGenerators).
              super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppcVar8 !=
        (pcVar1->TestGenerators).
        super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        cmTestGenerator::Compute(*ppcVar8,(cmLocalGenerator *)local_360._24_8_);
        cmScriptGenerator::Generate
                  (&(*ppcVar8)->super_cmScriptGenerator,(ostream *)local_278,&local_2b8,&local_298);
        ppcVar8 = ppcVar8 + 1;
      } while (ppcVar8 !=
               (pcVar1->TestGenerators).
               super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    cmMakefile::GetStateSnapshot(*(cmMakefile **)(local_360._24_8_ + 0x28));
    cmStateSnapshot::GetChildren
              ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_308.UpPositions,
               (cmStateSnapshot *)local_370);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_370,pcVar9);
    pcVar4 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)local_370);
    std::__cxx11::string::string((string *)local_318,pcVar4,(allocator *)local_370);
    if (local_308.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_308.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (cmOutputConverter *)(local_360._24_8_ + 8);
      pcVar9 = (cmStateSnapshot *)
               local_308.UpPositions.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_370,pcVar9);
        pcVar4 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)local_370);
        std::__cxx11::string::string((string *)&local_338,pcVar4,(allocator *)(local_360 + 0x27));
        cmOutputConverter::ConvertToRelativePath
                  ((string *)local_370,this_00,(string *)local_318,&local_338);
        std::__cxx11::string::operator=((string *)&local_338,(string *)local_370);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_360) {
          operator_delete((void *)local_370._0_8_,(ulong)(local_360._0_8_ + 1));
        }
        cmOutputConverter::EscapeForCMake((string *)local_370,&local_338);
        std::__cxx11::string::operator=((string *)&local_338,(string *)local_370);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_360) {
          operator_delete((void *)local_370._0_8_,(ulong)(local_360._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"subdirs(",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_278,local_338._M_dataplus._M_p,
                            local_338._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        pcVar9 = pcVar9 + 1;
      } while (pcVar9 != (cmStateSnapshot *)
                         local_308.UpPositions.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    pcVar1 = *(cmMakefile **)(local_360._24_8_ + 0x28);
    local_370._0_8_ = local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"CMAKE_DIRECTORY_LABELS","")
    ;
    pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)local_370);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_360) {
      operator_delete((void *)local_370._0_8_,(ulong)(local_360._0_8_ + 1));
    }
    pcVar1 = *(cmMakefile **)(local_360._24_8_ + 0x28);
    local_370._0_8_ = local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"LABELS","");
    __s = cmMakefile::GetProperty(pcVar1,(string *)local_370);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_360) {
      operator_delete((void *)local_370._0_8_,(ulong)(local_360._0_8_ + 1));
    }
    if (pcVar4 != (char *)0x0 || __s != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"set_directory_properties(PROPERTIES LABELS ",0x2b);
      if (__s != (char *)0x0) {
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        sVar6 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,__s,__s + sVar6);
        cmOutputConverter::EscapeForCMake((string *)local_370,&local_338);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,(char *)local_370._0_8_,local_370._8_8_);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_360) {
          operator_delete((void *)local_370._0_8_,(ulong)(local_360._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
      }
      if (__s != (char *)0x0 && pcVar4 != (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,";",1);
      }
      if (pcVar4 != (char *)0x0) {
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        sVar6 = strlen(pcVar4);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,pcVar4,pcVar4 + sVar6);
        cmOutputConverter::EscapeForCMake((string *)local_370,&local_338);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,(char *)local_370._0_8_,local_370._8_8_);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_370._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_360) {
          operator_delete((void *)local_370._0_8_,(ulong)(local_360._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,")",1);
      std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
      std::ostream::put((char)local_278);
      std::ostream::flush();
    }
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_318._0_8_ != &local_308)
    {
      operator_delete((void *)local_318._0_8_,
                      (ulong)((long)local_308.Data.
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    if ((cmStateSnapshot *)
        local_308.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (cmStateSnapshot *)0x0) {
      operator_delete(local_308.UpPositions.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_308.UpPositions.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.UpPositions.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
    if (local_2d8[0] != local_2c8) {
      operator_delete(local_2d8[0],local_2c8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_298);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if (!this->Makefile->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  file += "/";
  file += "CTestTestfile.cmake";

  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for " << std::endl
       << "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource() << std::endl
       << "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary() << std::endl
       << "# " << std::endl
       << "# This file includes the relevant testing commands "
       << "required for " << std::endl
       << "# testing this directory and lists subdirectories to "
       << "be tested as well." << std::endl;

  const char* testIncludeFile =
    this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if (testIncludeFile) {
    fout << "include(\"" << testIncludeFile << "\")" << std::endl;
  }

  const char* testIncludeFiles =
    this->Makefile->GetProperty("TEST_INCLUDE_FILES");
  if (testIncludeFiles) {
    std::vector<std::string> includesList;
    cmSystemTools::ExpandListArgument(testIncludeFiles, includesList);
    for (std::vector<std::string>::const_iterator i = includesList.begin();
         i != includesList.end(); ++i) {
      fout << "include(\"" << *i << "\")" << std::endl;
    }
  }

  // Ask each test generator to write its code.
  std::vector<cmTestGenerator*> const& testers =
    this->Makefile->GetTestGenerators();
  for (std::vector<cmTestGenerator*>::const_iterator gi = testers.begin();
       gi != testers.end(); ++gi) {
    (*gi)->Compute(this);
    (*gi)->Generate(fout, config, configurationTypes);
  }
  typedef std::vector<cmStateSnapshot> vec_t;
  vec_t const& children = this->Makefile->GetStateSnapshot().GetChildren();
  std::string parentBinDir = this->GetCurrentBinaryDirectory();
  for (vec_t::const_iterator i = children.begin(); i != children.end(); ++i) {
    // TODO: Use add_subdirectory instead?
    std::string outP = i->GetDirectory().GetCurrentBinary();
    outP = this->ConvertToRelativePath(parentBinDir, outP);
    outP = cmOutputConverter::EscapeForCMake(outP);
    fout << "subdirs(" << outP << ")" << std::endl;
  }

  // Add directory labels property
  const char* directoryLabels =
    this->Makefile->GetDefinition("CMAKE_DIRECTORY_LABELS");
  const char* labels = this->Makefile->GetProperty("LABELS");

  if (labels || directoryLabels) {
    fout << "set_directory_properties(PROPERTIES LABELS ";
    if (labels) {
      fout << cmOutputConverter::EscapeForCMake(labels);
    }
    if (labels && directoryLabels) {
      fout << ";";
    }
    if (directoryLabels) {
      fout << cmOutputConverter::EscapeForCMake(directoryLabels);
    }
    fout << ")" << std::endl;
  }
}